

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddCryptedKey
          (LegacyScriptPubKeyMan *this,CPubKey *vchPubKey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret)

{
  WalletBatch *this_00;
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  WalletBatch local_60;
  unique_lock<std::recursive_mutex> local_50;
  CKeyID local_3c;
  long local_28;
  WalletDatabase *pWVar4;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  LegacyDataSPKM::AddCryptedKeyInner(&this->super_LegacyDataSPKM,vchPubKey,vchCryptedSecret);
  local_50._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_50._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_50);
  this_00 = this->encrypted_batch;
  if (this_00 == (WalletBatch *)0x0) {
    iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3]
            )();
    pWVar4 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
    (*pWVar4->_vptr_WalletDatabase[0xe])(&local_60,pWVar4,1);
    local_60.m_database = pWVar4;
    CPubKey::GetID(&local_3c,vchPubKey);
    pmVar3 = std::
             map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
             ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,&local_3c);
    bVar1 = WalletBatch::WriteCryptedKey(&local_60,vchPubKey,vchCryptedSecret,pmVar3);
    if ((tuple<wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
        local_60.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_60.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
    }
  }
  else {
    CPubKey::GetID(&local_3c,vchPubKey);
    pmVar3 = std::
             map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
             ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,&local_3c);
    bVar1 = WalletBatch::WriteCryptedKey(this_00,vchPubKey,vchCryptedSecret,pmVar3);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddCryptedKey(const CPubKey &vchPubKey,
                            const std::vector<unsigned char> &vchCryptedSecret)
{
    if (!AddCryptedKeyInner(vchPubKey, vchCryptedSecret))
        return false;
    {
        LOCK(cs_KeyStore);
        if (encrypted_batch)
            return encrypted_batch->WriteCryptedKey(vchPubKey,
                                                        vchCryptedSecret,
                                                        mapKeyMetadata[vchPubKey.GetID()]);
        else
            return WalletBatch(m_storage.GetDatabase()).WriteCryptedKey(vchPubKey,
                                                            vchCryptedSecret,
                                                            mapKeyMetadata[vchPubKey.GetID()]);
    }
}